

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O2

Hull * __thiscall
hacd::vector<HACD::HACD_API::Hull>::push_back(vector<HACD::HACD_API::Hull> *this,Hull *a)

{
  Hull *pHVar1;
  HaF32 *pHVar2;
  HaU32 capacity;
  uint uVar3;
  uint uVar4;
  HaU32 HVar5;
  
  uVar3 = this->mCapacity & 0x7fffffff;
  uVar4 = this->mSize;
  if (uVar3 <= uVar4) {
    HVar5 = 1;
    if (uVar3 != 0) {
      HVar5 = uVar3 * 2;
    }
    grow(this,HVar5);
    uVar4 = this->mSize;
  }
  pHVar1 = this->mData;
  pHVar1[uVar4].mIndices = a->mIndices;
  HVar5 = a->mVertexCount;
  pHVar2 = a->mVertices;
  pHVar1 = pHVar1 + uVar4;
  pHVar1->mTriangleCount = a->mTriangleCount;
  pHVar1->mVertexCount = HVar5;
  pHVar1->mVertices = pHVar2;
  uVar4 = this->mSize;
  this->mSize = uVar4 + 1;
  return this->mData + uVar4;
}

Assistant:

HACD_FORCE_INLINE T& push_back(const T& a)
		{
			if(capacity()<=mSize) 
				grow(capacityIncrement());

			HACD_PLACEMENT_NEW((void*)(mData + mSize),T)(a);

			return mData[mSize++];
		}